

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int zisofs_finish_entry(archive_write *a)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int64_t tail;
  size_t s;
  uchar buff [16];
  isofile *file;
  iso9660_conflict *iso9660;
  archive_write *a_local;
  
  pvVar1 = a->format_data;
  buff._8_8_ = *(long *)((long)pvVar1 + 0x10);
  archive_entry_set_size
            (*(archive_entry **)(buff._8_8_ + 0x20),*(la_int64_t *)((long)pvVar1 + 0x238));
  lVar2 = *(long *)((long)a->format_data + 0x102f0);
  lVar3 = *(long *)((long)a->format_data + 0x102e0);
  s._0_1_ = '7';
  s._1_1_ = 0xe4;
  s._2_1_ = 'S';
  s._3_1_ = 0x96;
  s._4_1_ = 0xc9;
  s._5_1_ = 0xdb;
  s._6_1_ = 0xd6;
  s._7_1_ = '\a';
  set_num_731(buff,*(uint32_t *)(buff._8_8_ + 0xc4));
  buff[4] = *(uchar *)(buff._8_8_ + 0xc0);
  buff[5] = *(uchar *)(buff._8_8_ + 0xc1);
  buff[7] = '\0';
  buff[6] = '\0';
  wb_set_offset(a,*(int64_t *)(buff._8_8_ + 0x90));
  iVar4 = wb_write_to_temp(a,&s,0x10);
  if (iVar4 == 0) {
    iVar4 = wb_write_to_temp(a,*(void **)((long)pvVar1 + 0x220),
                             (long)*(int *)((long)pvVar1 + 0x230) << 2);
    if (iVar4 == 0) {
      wb_set_offset(a,(lVar2 + 0x10000) - lVar3);
      a_local._4_4_ = 0;
    }
    else {
      a_local._4_4_ = -0x1e;
    }
  }
  else {
    a_local._4_4_ = -0x1e;
  }
  return a_local._4_4_;
}

Assistant:

static int
zisofs_finish_entry(struct archive_write *a)
{
	struct iso9660 *iso9660 = a->format_data;
	struct isofile *file = iso9660->cur_file;
	unsigned char buff[16];
	size_t s;
	int64_t tail;

	/* Direct temp file stream to zisofs temp file stream. */
	archive_entry_set_size(file->entry, iso9660->zisofs.total_size);

	/*
	 * Save a file pointer which points the end of current zisofs data.
	 */
	tail = wb_offset(a);

	/*
	 * Make a header.
	 *
	 * +-----------------+----------------+-----------------+
	 * | Header 16 bytes | Block Pointers | Compressed data |
	 * +-----------------+----------------+-----------------+
	 * 0                16               +X
	 * Block Pointers :
	 *   4 * (((Uncompressed file size + block_size -1) / block_size) + 1)
	 *
	 * Write zisofs header.
	 *    Magic number
	 * +----+----+----+----+----+----+----+----+
	 * | 37 | E4 | 53 | 96 | C9 | DB | D6 | 07 |
	 * +----+----+----+----+----+----+----+----+
	 * 0    1    2    3    4    5    6    7    8
	 *
	 * +------------------------+------------------+
	 * | Uncompressed file size | header_size >> 2 |
	 * +------------------------+------------------+
	 * 8                       12                 13
	 *
	 * +-----------------+----------------+
	 * | log2 block_size | Reserved(0000) |
	 * +-----------------+----------------+
	 * 13               14               16
	 */
	memcpy(buff, zisofs_magic, 8);
	set_num_731(buff+8, file->zisofs.uncompressed_size);
	buff[12] = file->zisofs.header_size;
	buff[13] = file->zisofs.log2_bs;
	buff[14] = buff[15] = 0;/* Reserved */

	/* Move to the right position to write the header. */
	wb_set_offset(a, file->content.offset_of_temp);

	/* Write the header. */
	if (wb_write_to_temp(a, buff, 16) != ARCHIVE_OK)
		return (ARCHIVE_FATAL);

	/*
	 * Write zisofs Block Pointers.
	 */
	s = iso9660->zisofs.block_pointers_cnt *
	    sizeof(iso9660->zisofs.block_pointers[0]);
	if (wb_write_to_temp(a, iso9660->zisofs.block_pointers, s)
	    != ARCHIVE_OK)
		return (ARCHIVE_FATAL);

	/* Set a file pointer back to the end of the temporary file. */
	wb_set_offset(a, tail);

	return (ARCHIVE_OK);
}